

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

void x509_crt_verify_chain_reset(mbedtls_x509_crt_verify_chain *ver_chain)

{
  ulong local_18;
  size_t i;
  mbedtls_x509_crt_verify_chain *ver_chain_local;
  
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    ver_chain->items[local_18].crt = (mbedtls_x509_crt *)0x0;
    ver_chain->items[local_18].flags = 0xffffffff;
  }
  ver_chain->len = 0;
  return;
}

Assistant:

static void x509_crt_verify_chain_reset(
    mbedtls_x509_crt_verify_chain *ver_chain)
{
    size_t i;

    for (i = 0; i < MBEDTLS_X509_MAX_VERIFY_CHAIN_SIZE; i++) {
        ver_chain->items[i].crt = NULL;
        ver_chain->items[i].flags = (uint32_t) -1;
    }

    ver_chain->len = 0;

#if defined(MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK)
    ver_chain->trust_ca_cb_result = NULL;
#endif /* MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK */
}